

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Match(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              *uri,bool full)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar1 = (&uri->uri_)[!full];
  pcVar3 = (&this->uri_)[!full];
  if (pcVar3 == pcVar1) {
    return true;
  }
  if (pcVar1 == (char *)0x0 || pcVar3 == (char *)0x0) {
    return false;
  }
  cVar2 = *pcVar3;
  while (cVar2 != '\0') {
    pcVar3 = pcVar3 + 1;
    if (cVar2 != *pcVar1) goto LAB_00125a43;
    pcVar1 = pcVar1 + 1;
    cVar2 = *pcVar3;
  }
  cVar2 = '\0';
LAB_00125a43:
  return cVar2 == *pcVar1;
}

Assistant:

bool Match(const GenericUri& uri, bool full = true) const {
        Ch* s1;
        Ch* s2;
        if (full) {
            s1 = uri_;
            s2 = uri.uri_;
        } else {
            s1 = base_;
            s2 = uri.base_;
        }
        if (s1 == s2) return true;
        if (s1 == 0 || s2 == 0) return false;
        return internal::StrCmp<Ch>(s1, s2) == 0;
    }